

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O0

void txreconciliation_tests::IsPeerRegisteredTest_invoker(void)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  IsPeerRegisteredTest t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1f8;
  std_string *in_stack_fffffffffffff200;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff208;
  IsPeerRegisteredTest *in_stack_fffffffffffff218;
  const_string *in_stack_fffffffffffff220;
  const_string *msg;
  size_t in_stack_fffffffffffff228;
  size_t line_num;
  const_string *in_stack_fffffffffffff230;
  unit_test_log_t *in_stack_fffffffffffff238;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [1488];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  IsPeerRegisteredTest::IsPeerRegisteredTest(in_stack_fffffffffffff218);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [16])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::setup_conditional<txreconciliation_tests::IsPeerRegisteredTest>
            ((IsPeerRegisteredTest *)0xb95f00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [13])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  IsPeerRegisteredTest::test_method((IsPeerRegisteredTest *)pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff208,(char (*) [19])in_stack_fffffffffffff200);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar1,(const_string *)file,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::teardown_conditional<txreconciliation_tests::IsPeerRegisteredTest>
            ((IsPeerRegisteredTest *)0xb96126);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  msg = local_c38;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  this = boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this,s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar1,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  IsPeerRegisteredTest::~IsPeerRegisteredTest((IsPeerRegisteredTest *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPeerRegisteredTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));

    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));

    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}